

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

int gt_phys_redir_timeridx(CPUARMState_conflict *env)

{
  ARMMMUIdx AVar1;
  int iVar2;
  
  AVar1 = arm_mmu_idx_aarch64(env);
  iVar2 = 0;
  if (AVar1 - ARMMMUIdx_E20_0 < 6) {
    iVar2 = *(int *)(&DAT_00b80b1c + (ulong)(AVar1 - ARMMMUIdx_E20_0) * 4);
  }
  return iVar2;
}

Assistant:

static int gt_phys_redir_timeridx(CPUARMState *env)
{
    switch (arm_mmu_idx(env)) {
    case ARMMMUIdx_E20_0:
    case ARMMMUIdx_E20_2:
    case ARMMMUIdx_E20_2_PAN:
        return GTIMER_HYP;
    default:
        return GTIMER_PHYS;
    }
}